

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hh
# Opt level: O2

string * __thiscall
tchecker::system::processes_t::process_name_abi_cxx11_(processes_t *this,process_id_t id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  process_id_t id_local;
  
  id_local = id;
  pbVar1 = index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           ::key(&this->_procs_index,&id_local);
  return pbVar1;
}

Assistant:

inline std::string const & process_name(tchecker::process_id_t id) const
  {
    try {
      return _procs_index.key(id);
    }
    catch (...) {
      throw std::invalid_argument("Unknown process identifier " + std::to_string(id));
    }
  }